

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O3

size_type __thiscall lf::base::RefEl::NumSubEntities(RefEl *this,dim_t sub_codim)

{
  dim_t dVar1;
  uint uVar2;
  runtime_error *this_00;
  
  dVar1 = internal::DimensionImpl(this->type_);
  if (dVar1 < sub_codim) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"sub_codim > Dimension()");
LAB_0011ffe8:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (sub_codim == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = (uint)this->type_;
    if (2 < (byte)(this->type_ - kSegment)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"RefEl::NumSubEntities() not implemented for this RefElType.");
      goto LAB_0011ffe8;
    }
  }
  return uVar2;
}

Assistant:

[[nodiscard]] constexpr size_type NumSubEntities(dim_t sub_codim) const {
    LF_ASSERT_MSG_CONSTEXPR(sub_codim >= 0, "sub_codim is negative");
    LF_ASSERT_MSG_CONSTEXPR(sub_codim <= Dimension(),
                            "sub_codim > Dimension()");
    if (sub_codim == 0) {
      return 1;
    }
    switch (type_) {
      case RefElType::kSegment:
        return 2;  // sub_codim=1
      case RefElType::kTria:
        return 3;  // sub_codim=1,2
      case RefElType::kQuad:
        return 4;  // sub_codim=1,2
      default:
        LF_ASSERT_MSG_CONSTEXPR(
            false,
            "RefEl::NumSubEntities() not implemented for this RefElType.");
    }
    return 0;  // prevent warnings from compilers
  }